

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O1

string * __thiscall
AssemblyCode::MoveMemFromConstCommand::ToString_abi_cxx11_
          (string *__return_storage_ptr__,MoveMemFromConstCommand *this)

{
  undefined8 *puVar1;
  uint uVar2;
  uint __val;
  long lVar3;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  long *plVar8;
  ulong *puVar9;
  size_type *psVar10;
  ulong uVar11;
  uint __len;
  string __str;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  IRT::CTemp::ToString_abi_cxx11_(&local_50,&this->target);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x15facd);
  local_70 = &local_60;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar5[3];
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_80 = *puVar9;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar9;
    local_90 = (ulong *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar2 = this->constant;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar11 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar7 = (uint)uVar11;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_0014caf9;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_0014caf9;
      }
      if (uVar7 < 10000) goto LAB_0014caf9;
      uVar11 = uVar11 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_0014caf9:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_b0),__len,__val);
  uVar11 = 0xf;
  if (local_90 != &local_80) {
    uVar11 = local_80;
  }
  if (uVar11 < (ulong)(local_a8 + local_88)) {
    uVar11 = 0xf;
    if (local_b0 != local_a0) {
      uVar11 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_88) <= uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
      goto LAB_0014cb88;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
LAB_0014cb88:
  local_d0 = &local_c0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_c0 = *puVar1;
    uStack_b8 = puVar6[3];
  }
  else {
    local_c0 = *puVar1;
    local_d0 = (undefined8 *)*puVar6;
  }
  local_c8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar10) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblyCode::MoveMemFromConstCommand::ToString( ) const {
    return "mov " + target.ToString( ) + " [" + std::to_string( constant ) + "]\n";
}